

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void cvRestore(CVodeMem cv_mem,sunrealtype saved_t)

{
  long in_RDI;
  undefined8 in_XMM0_Qa;
  int k;
  int j;
  undefined4 local_18;
  undefined4 local_14;
  
  *(undefined8 *)(in_RDI + 0x408) = in_XMM0_Qa;
  for (local_18 = 1; local_18 <= *(int *)(in_RDI + 0x3c0); local_18 = local_18 + 1) {
    for (local_14 = *(int *)(in_RDI + 0x3c0); local_18 <= local_14; local_14 = local_14 + -1) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                   *(undefined8 *)(in_RDI + 0x150 + (long)(local_14 + -1) * 8),
                   *(undefined8 *)(in_RDI + 0x150 + (long)local_14 * 8),
                   *(undefined8 *)(in_RDI + 0x150 + (long)(local_14 + -1) * 8));
    }
  }
  if (*(int *)(in_RDI + 0x5c) != 0) {
    for (local_18 = 1; local_18 <= *(int *)(in_RDI + 0x3c0); local_18 = local_18 + 1) {
      for (local_14 = *(int *)(in_RDI + 0x3c0); local_18 <= local_14; local_14 = local_14 + -1) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                     *(undefined8 *)(in_RDI + 0x200 + (long)(local_14 + -1) * 8),
                     *(undefined8 *)(in_RDI + 0x200 + (long)local_14 * 8),
                     *(undefined8 *)(in_RDI + 0x200 + (long)(local_14 + -1) * 8));
      }
    }
  }
  if (*(int *)(in_RDI + 0x8c) != 0) {
    for (local_18 = 1; local_18 <= *(int *)(in_RDI + 0x3c0); local_18 = local_18 + 1) {
      for (local_14 = *(int *)(in_RDI + 0x3c0); local_18 <= local_14; local_14 = local_14 + -1) {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,*(undefined4 *)(in_RDI + 0x90),
                   *(undefined8 *)(in_RDI + 0x288 + (long)(local_14 + -1) * 8),
                   *(undefined8 *)(in_RDI + 0x288 + (long)local_14 * 8),
                   *(undefined8 *)(in_RDI + 0x288 + (long)(local_14 + -1) * 8));
      }
    }
  }
  if (*(int *)(in_RDI + 0x108) != 0) {
    for (local_18 = 1; local_18 <= *(int *)(in_RDI + 0x3c0); local_18 = local_18 + 1) {
      for (local_14 = *(int *)(in_RDI + 0x3c0); local_18 <= local_14; local_14 = local_14 + -1) {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,*(undefined4 *)(in_RDI + 0x90),
                   *(undefined8 *)(in_RDI + 800 + (long)(local_14 + -1) * 8),
                   *(undefined8 *)(in_RDI + 800 + (long)local_14 * 8),
                   *(undefined8 *)(in_RDI + 800 + (long)(local_14 + -1) * 8));
      }
    }
  }
  return;
}

Assistant:

void cvRestore(CVodeMem cv_mem, sunrealtype saved_t)
{
  int j, k;

  cv_mem->cv_tn = saved_t;
  for (k = 1; k <= cv_mem->cv_q; k++)
  {
    for (j = cv_mem->cv_q; j >= k; j--)
    {
      N_VLinearSum(ONE, cv_mem->cv_zn[j - 1], -ONE, cv_mem->cv_zn[j],
                   cv_mem->cv_zn[j - 1]);
    }
  }

  if (cv_mem->cv_quadr)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        N_VLinearSum(ONE, cv_mem->cv_znQ[j - 1], -ONE, cv_mem->cv_znQ[j],
                     cv_mem->cv_znQ[j - 1]);
      }
    }
  }

  if (cv_mem->cv_sensi)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        (void)N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znS[j - 1],
                                      -ONE, cv_mem->cv_znS[j],
                                      cv_mem->cv_znS[j - 1]);
      }
    }
  }

  if (cv_mem->cv_quadr_sensi)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        (void)N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znQS[j - 1],
                                      -ONE, cv_mem->cv_znQS[j],
                                      cv_mem->cv_znQS[j - 1]);
      }
    }
  }
}